

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::MockCodeGenerator::GetOutputFileContent_abi_cxx11_
          (string *__return_storage_ptr__,MockCodeGenerator *this,string_view generator_name,
          string_view parameter,FileDescriptor *file,GeneratorContext *context)

{
  int iVar1;
  Descriptor *this_00;
  pointer ppFVar2;
  string_view parameter_00;
  string_view generator_name_00;
  string_view local_d8;
  string local_c8;
  string_view local_a8;
  string_view local_98;
  char *local_88;
  size_t sStack_80;
  MockCodeGenerator *local_78;
  size_t sStack_70;
  undefined1 local_50 [8];
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  all_files;
  FileDescriptor *file_local;
  string_view parameter_local;
  string_view generator_name_local;
  
  ppFVar2 = (pointer)parameter._M_str;
  all_files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppFVar2;
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)local_50);
  (**(code **)(*(long *)file + 0x30))
            (file,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)local_50);
  local_88 = generator_name._M_str;
  sStack_80 = parameter._M_len;
  local_78 = this;
  sStack_70 = generator_name._M_len;
  local_98 = FileDescriptor::name
                       ((FileDescriptor *)
                        all_files.
                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  compiler::(anonymous_namespace)::CommaSeparatedList_abi_cxx11_
            (&local_c8,(_anonymous_namespace_ *)local_50,
             (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)local_98._M_str);
  local_a8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
  iVar1 = FileDescriptor::message_type_count
                    ((FileDescriptor *)
                     all_files.
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar1 < 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"(none)");
  }
  else {
    this_00 = FileDescriptor::message_type
                        ((FileDescriptor *)
                         all_files.
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_d8 = Descriptor::name(this_00);
  }
  parameter_00._M_str = (char *)ppFVar2;
  parameter_00._M_len = sStack_80;
  generator_name_00._M_str = local_88;
  generator_name_00._M_len = sStack_70;
  GetOutputFileContent_abi_cxx11_
            (__return_storage_ptr__,local_78,generator_name_00,parameter_00,local_98,local_a8,
             local_d8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string MockCodeGenerator::GetOutputFileContent(
    absl::string_view generator_name, absl::string_view parameter,
    const FileDescriptor* file, GeneratorContext* context) {
  std::vector<const FileDescriptor*> all_files;
  context->ListParsedFiles(&all_files);
  return GetOutputFileContent(
      generator_name, parameter, file->name(), CommaSeparatedList(all_files),
      file->message_type_count() > 0 ? file->message_type(0)->name()
                                     : "(none)");
}